

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3_reset_auto_extension(void)

{
  bool bVar1;
  int iVar2;
  sqlite3_mutex *psVar3;
  
  iVar2 = sqlite3_initialize();
  if (iVar2 != 0) {
    return;
  }
  bVar1 = true;
  if ((sqlite3Config.bCoreMutex == 0) ||
     (psVar3 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar3 == (sqlite3_mutex *)0x0)) {
    psVar3 = (sqlite3_mutex *)0x0;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(psVar3);
    bVar1 = false;
  }
  sqlite3_free(sqlite3Autoext_1);
  sqlite3Autoext_1 = (void *)0x0;
  sqlite3Autoext_0 = 0;
  if (bVar1) {
    sqlite3Autoext_1 = (void *)0x0;
    sqlite3Autoext_0 = 0;
    return;
  }
  (*sqlite3Config.mutex.xMutexLeave)(psVar3);
  return;
}

Assistant:

SQLITE_API void sqlite3_reset_auto_extension(void){
#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize()==SQLITE_OK )
#endif
  {
#if SQLITE_THREADSAFE
    sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
#endif
    wsdAutoextInit;
    sqlite3_mutex_enter(mutex);
    sqlite3_free(wsdAutoext.aExt);
    wsdAutoext.aExt = 0;
    wsdAutoext.nExt = 0;
    sqlite3_mutex_leave(mutex);
  }
}